

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::
basic_json_encoder(basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
                   *this,stream_sink<wchar_t> *sink,basic_json_encode_options<wchar_t> *options,
                  allocator<char> *alloc)

{
  int iVar1;
  spaces_option sVar2;
  bool bVar3;
  basic_json_encode_options<wchar_t> *in_RDX;
  basic_json_visitor<wchar_t> *in_RDI;
  stream_sink<wchar_t> *in_stack_fffffffffffffc78;
  wstring *pwVar4;
  stream_sink<wchar_t> *in_stack_fffffffffffffc80;
  allocator<wchar_t> *paVar5;
  basic_json_encode_options<wchar_t> *in_stack_fffffffffffffc88;
  basic_json_encode_options<wchar_t> *in_stack_fffffffffffffc90;
  allocator<wchar_t> local_2a9;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 *local_2a0;
  undefined8 local_298;
  wstring local_290 [39];
  allocator<wchar_t> local_269;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 *local_260;
  undefined8 local_258;
  wstring local_250 [39];
  allocator<wchar_t> local_229;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 *local_220;
  undefined8 local_218;
  wstring local_210 [39];
  allocator<wchar_t> local_1e9;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  wstring local_1d0 [35];
  allocator<wchar_t> local_1ad;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 *local_1a0;
  undefined8 local_198;
  wstring local_190 [39];
  allocator<wchar_t> local_169;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 *local_160;
  undefined8 local_158;
  wstring local_150 [39];
  allocator<wchar_t> local_129;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 *local_120;
  undefined8 local_118;
  wstring local_110 [35];
  allocator<wchar_t> local_ed;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 *local_e0;
  undefined8 local_d8;
  wstring local_d0 [39];
  allocator<wchar_t> local_a9;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 *local_a0;
  undefined8 local_98;
  wstring local_90 [39];
  allocator<wchar_t> local_69;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 *local_60;
  undefined8 local_58;
  wstring local_50 [56];
  basic_json_encode_options<wchar_t> *local_18;
  
  local_18 = in_RDX;
  basic_json_visitor<wchar_t>::basic_json_visitor(in_RDI);
  in_RDI->_vptr_basic_json_visitor = (_func_int **)&PTR__basic_json_encoder_0134e8d8;
  stream_sink<wchar_t>::stream_sink(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  basic_json_encode_options<wchar_t>::basic_json_encode_options
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  basic_json_encode_options<wchar_t>::float_format(local_18);
  basic_json_encode_options<wchar_t>::precision(local_18);
  detail::write_double::write_double
            ((write_double *)in_stack_fffffffffffffc90,
             (float_chars_format)((ulong)in_stack_fffffffffffffc88 >> 0x38),
             (int)in_stack_fffffffffffffc88);
  std::
  allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>
  ::allocator<char>((allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>
                     *)in_stack_fffffffffffffc80,(allocator<char> *)in_stack_fffffffffffffc78);
  std::
  vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  ::vector((vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
            *)in_stack_fffffffffffffc80,(allocator_type *)in_stack_fffffffffffffc78);
  std::
  allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>
  ::~allocator((allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>
                *)0x9dc845);
  *(undefined4 *)&in_RDI[0x34]._vptr_basic_json_visitor = 0;
  in_RDI[0x35]._vptr_basic_json_visitor = (_func_int **)0x0;
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x36));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x3a));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x3e));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x42));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x46));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x4a));
  *(undefined4 *)&in_RDI[0x4e]._vptr_basic_json_visitor = 0;
  sVar2 = basic_json_encode_options<wchar_t>::spaces_around_colon(local_18);
  iVar1 = (int)in_RDI;
  if (sVar2 == space_after) {
    local_68 = 0x3a;
    local_64 = 0x20;
    local_60 = &local_68;
    local_58 = 2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_50,local_60,local_58,&local_69);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x36),local_50);
    std::__cxx11::wstring::~wstring(local_50);
    std::allocator<wchar_t>::~allocator(&local_69);
  }
  else if (sVar2 == space_before) {
    local_a8 = 0x20;
    local_a4 = 0x3a;
    local_a0 = &local_a8;
    local_98 = 2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_90,local_a0,local_98,&local_a9);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x36),local_90);
    std::__cxx11::wstring::~wstring(local_90);
    std::allocator<wchar_t>::~allocator(&local_a9);
  }
  else if (sVar2 == space_before_and_after) {
    local_ec = 0x20;
    local_e8 = 0x3a;
    local_e4 = 0x20;
    local_e0 = &local_ec;
    local_d8 = 3;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_d0,local_e0,local_d8,&local_ed);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x36),local_d0);
    std::__cxx11::wstring::~wstring(local_d0);
    std::allocator<wchar_t>::~allocator(&local_ed);
  }
  else {
    std::__cxx11::wstring::push_back(iVar1 + L'ư');
  }
  sVar2 = basic_json_encode_options<wchar_t>::spaces_around_comma(local_18);
  if (sVar2 == space_after) {
    local_128 = 0x2c;
    local_124 = 0x20;
    local_120 = &local_128;
    local_118 = 2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_110,local_120,local_118,&local_129);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x3a),local_110);
    std::__cxx11::wstring::~wstring(local_110);
    std::allocator<wchar_t>::~allocator(&local_129);
  }
  else if (sVar2 == space_before) {
    local_168 = 0x20;
    local_164 = 0x2c;
    local_160 = &local_168;
    local_158 = 2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_150,local_160,local_158,&local_169);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x3a),local_150);
    std::__cxx11::wstring::~wstring(local_150);
    std::allocator<wchar_t>::~allocator(&local_169);
  }
  else if (sVar2 == space_before_and_after) {
    local_1ac = 0x20;
    local_1a8 = 0x2c;
    local_1a4 = 0x20;
    local_1a0 = &local_1ac;
    local_198 = 3;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_190,local_1a0,local_198,&local_1ad);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x3a),local_190);
    std::__cxx11::wstring::~wstring(local_190);
    std::allocator<wchar_t>::~allocator(&local_1ad);
  }
  else {
    std::__cxx11::wstring::push_back(iVar1 + L'ǐ');
  }
  bVar3 = basic_json_encode_options<wchar_t>::pad_inside_object_braces(local_18);
  if (bVar3) {
    local_1e8 = 0x7b;
    local_1e4 = 0x20;
    local_1e0 = &local_1e8;
    local_1d8 = 2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_1d0,local_1e0,local_1d8,&local_1e9);
    pwVar4 = local_1d0;
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x3e),pwVar4);
    std::__cxx11::wstring::~wstring(pwVar4);
    std::allocator<wchar_t>::~allocator(&local_1e9);
    local_228 = 0x20;
    local_224 = 0x7d;
    local_220 = &local_228;
    local_218 = 2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_210,local_220,local_218,&local_229);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x42),local_210);
    std::__cxx11::wstring::~wstring(local_210);
    std::allocator<wchar_t>::~allocator(&local_229);
  }
  else {
    std::__cxx11::wstring::push_back(iVar1 + L'ǰ');
    std::__cxx11::wstring::push_back(iVar1 + L'Ȑ');
  }
  bVar3 = basic_json_encode_options<wchar_t>::pad_inside_array_brackets(local_18);
  if (bVar3) {
    local_268 = 0x5b;
    local_264 = 0x20;
    local_260 = &local_268;
    local_258 = 2;
    paVar5 = &local_269;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_250,local_260,local_258,paVar5);
    pwVar4 = local_250;
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x46),pwVar4);
    std::__cxx11::wstring::~wstring(pwVar4);
    std::allocator<wchar_t>::~allocator(&local_269);
    local_2a8 = 0x20;
    local_2a4 = 0x5d;
    local_2a0 = &local_2a8;
    local_298 = 2;
    paVar5 = &local_2a9;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_290,local_2a0,local_298,paVar5);
    std::__cxx11::wstring::operator=((wstring *)(in_RDI + 0x4a),local_290);
    std::__cxx11::wstring::~wstring(local_290);
    std::allocator<wchar_t>::~allocator(&local_2a9);
  }
  else {
    std::__cxx11::wstring::push_back(iVar1 + L'Ȱ');
    std::__cxx11::wstring::push_back(iVar1 + L'ɐ');
  }
  return;
}

Assistant:

basic_json_encoder(Sink&& sink, 
                           const basic_json_encode_options<CharT>& options, 
                           const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)), 
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc)
        {
            switch (options.spaces_around_colon())
            {
                case spaces_option::space_after:
                    colon_str_ = std::basic_string<CharT>({':',' '});
                    break;
                case spaces_option::space_before:
                    colon_str_ = std::basic_string<CharT>({' ',':'});
                    break;
                case spaces_option::space_before_and_after:
                    colon_str_ = std::basic_string<CharT>({' ',':',' '});
                    break;
                default:
                    colon_str_.push_back(':');
                    break;
            }
            switch (options.spaces_around_comma())
            {
                case spaces_option::space_after:
                    comma_str_ = std::basic_string<CharT>({',',' '});
                    break;
                case spaces_option::space_before:
                    comma_str_ = std::basic_string<CharT>({' ',','});
                    break;
                case spaces_option::space_before_and_after:
                    comma_str_ = std::basic_string<CharT>({' ',',',' '});
                    break;
                default:
                    comma_str_.push_back(',');
                    break;
            }
            if (options.pad_inside_object_braces())
            {
                open_object_brace_str_ = std::basic_string<CharT>({'{', ' '});
                close_object_brace_str_ = std::basic_string<CharT>({' ', '}'});
            }
            else
            {
                open_object_brace_str_.push_back('{');
                close_object_brace_str_.push_back('}');
            }
            if (options.pad_inside_array_brackets())
            {
                open_array_bracket_str_ = std::basic_string<CharT>({'[', ' '});
                close_array_bracket_str_ = std::basic_string<CharT>({' ', ']'});
            }
            else
            {
                open_array_bracket_str_.push_back('[');
                close_array_bracket_str_.push_back(']');
            }
        }